

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

QPalette __thiscall QApplication::palette(QApplication *this,QWidget *w)

{
  byte bVar1;
  Span *pSVar2;
  char *pcVar3;
  long lVar4;
  Entry *pEVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  undefined8 *puVar9;
  uint uVar10;
  PaletteHash PVar11;
  long in_FS_OFFSET;
  const_iterator cVar12;
  QPalette QVar13;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((w != (QWidget *)0x0) && (QApplicationPrivate::widgetPalettes.d != (Data *)0x0)) &&
     ((QApplicationPrivate::widgetPalettes.d)->size != 0)) {
    (*(code *)**(undefined8 **)w)(w);
    pcVar3 = (char *)QMetaObject::className();
    QByteArray::QByteArray(&local_50,pcVar3,-1);
    cVar12 = QHash<QByteArray,_QPalette>::constFindImpl<QByteArray>
                       (&QApplicationPrivate::widgetPalettes,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (cVar12.i.d != (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0 || cVar12.i.bucket != 0
       ) {
      pSVar2 = (cVar12.i.d)->spans;
      uVar6 = cVar12.i.bucket >> 7;
      pEVar5 = pSVar2[uVar6].entries;
      bVar1 = pSVar2[uVar6].offsets[(uint)cVar12.i.bucket & 0x7f];
LAB_002ba7b4:
      QPalette::QPalette((QPalette *)this,(QPalette *)(pEVar5[bVar1].storage.data + 0x18));
      uVar8 = extraout_RDX_00;
      goto LAB_002ba77c;
    }
    if (QApplicationPrivate::widgetPalettes.d == (Data *)0x0) {
      uVar6 = 0;
      PVar11.d = (Data *)0x0;
LAB_002ba6d2:
      if (PVar11.d == (Data *)0x0 && uVar6 == 0) goto LAB_002ba774;
    }
    else {
      PVar11.d = QApplicationPrivate::widgetPalettes.d;
      if ((QApplicationPrivate::widgetPalettes.d)->spans->offsets[0] == 0xff) {
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          if ((QApplicationPrivate::widgetPalettes.d)->numBuckets == uVar6) {
            uVar6 = 0;
            PVar11.d = (Data *)0x0;
            break;
          }
          uVar7 = uVar6 + 1;
        } while ((QApplicationPrivate::widgetPalettes.d)->spans[uVar6 >> 7].offsets
                 [(uint)uVar6 & 0x7f] == 0xff);
        goto LAB_002ba6d2;
      }
      uVar6 = 0;
    }
    do {
      uVar7 = uVar6 >> 7;
      uVar10 = (uint)uVar6 & 0x7f;
      puVar9 = *(undefined8 **)
                ((PVar11.d)->spans[uVar7].entries[(PVar11.d)->spans[uVar7].offsets[uVar10]].storage.
                 data + 8);
      if (puVar9 == (undefined8 *)0x0) {
        puVar9 = &QByteArray::_empty;
      }
      lVar4 = (**(code **)(*(long *)w + 8))(w,puVar9);
      if (lVar4 != 0) {
        pEVar5 = (PVar11.d)->spans[uVar7].entries;
        bVar1 = (PVar11.d)->spans[uVar7].offsets[uVar10];
        goto LAB_002ba7b4;
      }
      do {
        if ((PVar11.d)->numBuckets - 1 == uVar6) {
          PVar11.d = (Data *)0x0;
          uVar6 = 0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while ((PVar11.d)->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    } while ((PVar11.d != (Data *)0x0) || (uVar6 != 0));
  }
LAB_002ba774:
  QGuiApplication::palette();
  uVar8 = extraout_RDX;
LAB_002ba77c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar13._8_8_ = uVar8;
  QVar13.d = (QPalettePrivate *)this;
  return QVar13;
}

Assistant:

QPalette QApplication::palette(const QWidget* w)
{
    auto &widgetPalettes = QApplicationPrivate::widgetPalettes;
    if (w && !widgetPalettes.isEmpty()) {
        auto it = widgetPalettes.constFind(w->metaObject()->className());
        const auto cend = widgetPalettes.constEnd();
        if (it != cend)
            return *it;
        for (it = widgetPalettes.constBegin(); it != cend; ++it) {
            if (w->inherits(it.key()))
                return it.value();
        }
    }
    return palette();
}